

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::setTimeHorizon
          (OptimalControlProblem *this,double startingTime,double finalTime)

{
  key_type *pkVar1;
  bool bVar2;
  iterator iVar3;
  ostream *poVar4;
  key_type *__k;
  ostringstream errorMsg;
  char *local_1c0 [4];
  TimeRange local_1a0 [15];
  
  bVar2 = TimeRange::setTimeInterval(&this->m_pimpl->horizon,startingTime,finalTime);
  if (bVar2) {
    pkVar1 = (this->m_pimpl->mayerCostnames).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__k = (this->m_pimpl->mayerCostnames).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; __k != pkVar1; __k = __k + 1) {
      if (__k->_M_string_length != 0) {
        iVar3 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>_>
                ::find(&(this->m_pimpl->costs)._M_t,__k);
        if ((_Rb_tree_header *)iVar3._M_node ==
            &(this->m_pimpl->costs)._M_t._M_impl.super__Rb_tree_header) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
          poVar4 = std::operator<<((ostream *)local_1a0,"Unable to find cost named ");
          poVar4 = std::operator<<(poVar4,(string *)__k);
          std::endl<char,std::char_traits<char>>(poVar4);
          std::__cxx11::stringbuf::str();
          iDynTree::reportError("OptimalControlProblem","updateCostTimeRange",local_1c0[0]);
          std::__cxx11::string::~string((string *)local_1c0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
          goto LAB_0017d191;
        }
        TimeRange::Instant(local_1a0,finalTime);
        *(bool *)&iVar3._M_node[9]._M_color = local_1a0[0].m_anyTime;
        iVar3._M_node[8]._M_left = (_Base_ptr)local_1a0[0].m_initTime;
        iVar3._M_node[8]._M_right = (_Base_ptr)local_1a0[0].m_endTime;
      }
    }
    bVar2 = true;
  }
  else {
LAB_0017d191:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool OptimalControlProblem::setTimeHorizon(double startingTime, double finalTime)
        {
            if (!(m_pimpl->horizon.setTimeInterval(startingTime,finalTime))) {
                return false;
            }

            CostsMap::iterator costIterator;
            for (auto& mayerCost : m_pimpl->mayerCostnames){
                if (mayerCost.size() > 0){
                    costIterator = m_pimpl->costs.find(mayerCost);
                    if (costIterator == m_pimpl->costs.end()){
                        std::ostringstream errorMsg;
                        errorMsg << "Unable to find cost named "<<mayerCost<< std::endl;
                        reportError("OptimalControlProblem", "updateCostTimeRange", errorMsg.str().c_str());
                        return false;
                    }

                    costIterator->second.timeRange = TimeRange::Instant(finalTime);
                }
            }

            return true;
        }